

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O0

void anon_unknown.dwarf_2519ef::writeReadYa
               (Box2i *dw,int tileSizeX,int tileSizeY,char *fileName,
               _func_void_Array2D<Imf_3_4::Rgba>_ptr_int_int *fillPixels)

{
  char *pcVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  Rgba *pRVar6;
  char *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  Array2D<Imf_3_4::Rgba> *in_RDI;
  code *in_R8;
  float fVar7;
  float fVar8;
  Rgba *p2;
  Rgba *p1;
  int x;
  int y;
  TiledRgbaInputFile in;
  TiledRgbaOutputFile out;
  Array2D<Imf_3_4::Rgba> pixels2;
  Array2D<Imf_3_4::Rgba> pixels1;
  int h;
  int w;
  Array2D<Imf_3_4::Rgba> *this;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  long in_stack_fffffffffffffe98;
  Array2D<Imf_3_4::Rgba> *in_stack_fffffffffffffea0;
  int local_c8;
  int local_c4;
  Rgba local_c0 [7];
  Vec2<float> local_88;
  Rgba local_80 [5];
  Array2D<Imf_3_4::Rgba> local_58;
  Array2D<Imf_3_4::Rgba> local_40;
  int local_28;
  int local_24;
  code *local_20;
  char *local_18;
  undefined4 local_10;
  undefined4 local_c;
  Array2D<Imf_3_4::Rgba> *local_8;
  
  local_24 = ((int)in_RDI->_sizeY - *(int *)&in_RDI->_sizeX) + 1;
  local_28 = (*(int *)((long)&in_RDI->_sizeY + 4) - *(int *)((long)&in_RDI->_sizeX + 4)) + 1;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  (*local_20)(&local_40,local_24,local_28);
  poVar5 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  this = local_8;
  pcVar1 = local_18;
  Imath_3_2::Vec2<float>::Vec2(&local_88,0.0,0.0);
  uVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,local_80,pcVar1,local_c,local_10,0,0,this,this,0x18,
             &local_88,0,3,uVar2);
  pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[]
                     (&local_40,(long)-*(int *)((long)&local_8->_sizeX + 4));
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer
            (local_80,(ulong)(pRVar6 + -*(int *)&local_8->_sizeX),1);
  iVar3 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)local_80);
  iVar4 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)local_80);
  Imf_3_4::TiledRgbaOutputFile::writeTiles((int)local_80,0,iVar3 + -1,0,iVar4 + -1);
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_80);
  poVar5 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  pcVar1 = local_18;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)local_c0,pcVar1,iVar3);
  pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[]
                     (&local_58,(long)-*(int *)((long)&local_8->_sizeX + 4));
  Imf_3_4::TiledRgbaInputFile::setFrameBuffer
            (local_c0,(ulong)(pRVar6 + -*(int *)&local_8->_sizeX),1);
  iVar3 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_c0);
  iVar4 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_c0);
  Imf_3_4::TiledRgbaInputFile::readTiles((int)local_c0,0,iVar3 + -1,0,iVar4 + -1);
  Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_c0);
  poVar5 = std::operator<<((ostream *)&std::cout,"comparing");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_c4 = 0;
  do {
    if (local_28 <= local_c4) {
      remove(local_18);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(this);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(this);
      return;
    }
    for (local_c8 = 0; local_c8 < local_24; local_c8 = local_c8 + 1) {
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_40,(long)local_c4);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_58,(long)local_c4);
      fVar7 = Imath_3_2::half::operator_cast_to_float((half *)this);
      fVar8 = Imath_3_2::half::operator_cast_to_float((half *)this);
      if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
        __assert_fail("p1.r == p2.r",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                      ,0x86,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar7 = Imath_3_2::half::operator_cast_to_float((half *)this);
      fVar8 = Imath_3_2::half::operator_cast_to_float((half *)this);
      if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
        __assert_fail("p1.g == p2.g",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                      ,0x87,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar7 = Imath_3_2::half::operator_cast_to_float((half *)this);
      fVar8 = Imath_3_2::half::operator_cast_to_float((half *)this);
      if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
        __assert_fail("p1.b == p2.b",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                      ,0x88,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar7 = Imath_3_2::half::operator_cast_to_float((half *)this);
      fVar8 = Imath_3_2::half::operator_cast_to_float((half *)this);
      if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
        __assert_fail("p1.a == p2.a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                      ,0x89,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
    }
    local_c4 = local_c4 + 1;
  } while( true );
}

Assistant:

void
writeReadYa (
    Box2i&     dw,
    int        tileSizeX,
    int        tileSizeY,
    const char fileName[],
    void (*fillPixels) (Array2D<Rgba>& pixels, int w, int h))
{
    int           w = dw.max.x - dw.min.x + 1;
    int           h = dw.max.y - dw.min.y + 1;
    Array2D<Rgba> pixels1 (h, w);
    Array2D<Rgba> pixels2 (h, w);

    fillPixels (pixels1, w, h);

    cout << "writing " << flush;

    {
        TiledRgbaOutputFile out (
            fileName,
            tileSizeX,
            tileSizeY,
            ONE_LEVEL,
            ROUND_DOWN,
            dw,
            dw,
            WRITE_YA);

        out.setFrameBuffer (&pixels1[-dw.min.y][-dw.min.x], 1, w);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    cout << "reading " << flush;

    {
        TiledRgbaInputFile in (fileName);

        in.setFrameBuffer (&pixels2[-dw.min.y][-dw.min.x], 1, w);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
    }

    cout << "comparing" << endl;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            const Rgba& p1 = pixels1[y][x];
            const Rgba& p2 = pixels2[y][x];

            assert (p1.r == p2.r);
            assert (p1.g == p2.g);
            assert (p1.b == p2.b);
            assert (p1.a == p2.a);
        }
    }

    remove (fileName);
}